

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

void Gia_ManTerAnalyze2(Vec_Ptr_t *vStates,int nRegs)

{
  uint *puVar1;
  uint uVar2;
  void *__s;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  if (vStates->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
  uVar5 = vStates->nSize - 1;
  vStates->nSize = uVar5;
  __s = vStates->pArray[uVar5];
  uVar5 = ((nRegs >> 4) + 1) - (uint)((nRegs & 0xfU) == 0);
  memset(__s,0,(long)(int)uVar5 << 2);
  if (0 < vStates->nSize) {
    ppvVar6 = vStates->pArray;
    lVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        pvVar3 = ppvVar6[lVar7];
        uVar9 = 0;
        do {
          puVar1 = (uint *)((long)__s + uVar9 * 4);
          *puVar1 = *puVar1 | *(uint *)((long)pvVar3 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStates->nSize);
  }
  if (0 < nRegs) {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + 1;
    } while (nRegs != iVar8);
  }
  uVar10 = 0;
  printf("Found %d constant registers.\n");
  memset(__s,0,(long)(int)uVar5 << 2);
  if (0 < vStates->nSize) {
    ppvVar6 = vStates->pArray;
    lVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        pvVar3 = ppvVar6[lVar7];
        uVar9 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar3 + uVar9 * 4);
          puVar1 = (uint *)((long)__s + uVar9 * 4);
          *puVar1 = *puVar1 | ~(uVar2 >> 1 ^ uVar2) & 0x55555555;
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStates->nSize);
  }
  if (0 < nRegs) {
    bVar4 = 0;
    uVar10 = 0;
    uVar5 = 0;
    do {
      uVar10 = uVar10 + ((*(uint *)((long)__s + (ulong)(uVar5 >> 4) * 4) >> (bVar4 & 0x1e) & 3) == 0
                        );
      uVar5 = uVar5 + 1;
      bVar4 = bVar4 + 2;
    } while (nRegs != uVar5);
  }
  printf("Found %d non-ternary registers.\n",(ulong)uVar10);
  uVar5 = vStates->nCap;
  if (vStates->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vStates->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vStates->pArray,0x80);
      }
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar5 * 2;
      if (iVar8 <= (int)uVar5) goto LAB_0073c4cd;
      if (vStates->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vStates->pArray,(ulong)uVar5 << 4);
      }
    }
    vStates->pArray = ppvVar6;
    vStates->nCap = iVar8;
  }
LAB_0073c4cd:
  iVar8 = vStates->nSize;
  vStates->nSize = iVar8 + 1;
  vStates->pArray[iVar8] = __s;
  return;
}

Assistant:

void Gia_ManTerAnalyze2( Vec_Ptr_t * vStates, int nRegs )
{
    unsigned * pTemp, * pStates = (unsigned *)Vec_PtrPop( vStates );
    int i, w, nZeros, nConsts, nStateWords;
    // detect constant zero registers
    nStateWords = Abc_BitWordNum( 2*nRegs );
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= pTemp[w];
    // count the number of zeros
    nZeros = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == GIA_ZER )
            nZeros++;
    printf( "Found %d constant registers.\n", nZeros );
    // detect non-ternary registers
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= (~(pTemp[w] ^ (pTemp[w] >> 1)) & 0x55555555);
    // count the nonternary registers
    nConsts = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == 0 )
            nConsts++;
    printf( "Found %d non-ternary registers.\n", nConsts );
    // return the state back
    Vec_PtrPush( vStates, pStates );
}